

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFExpression.cpp
# Opt level: O1

bool __thiscall
llvm::DWARFExpression::Operation::extract
          (Operation *this,DataExtractor Data,uint16_t Version,uint8_t AddressSize,uint64_t Offset)

{
  bool bVar1;
  byte bVar2;
  char cVar3;
  uint16_t uVar4;
  uint32_t uVar5;
  int iVar6;
  ulong uVar7;
  uint64_t uVar8;
  undefined1 uVar9;
  uint8_t uVar10;
  Encoding EVar11;
  ulong uVar12;
  long lVar13;
  uint64_t local_38;
  uint64_t Offset_local;
  
  local_38 = Offset;
  bVar2 = DataExtractor::getU8(&Data,&local_38,(Error *)0x0);
  this->Opcode = bVar2;
  if ((getOpDesc(unsigned_int)::Descriptions == '\0') &&
     (iVar6 = __cxa_guard_acquire(&getOpDesc(unsigned_int)::Descriptions), iVar6 != 0)) {
    getDescriptions();
    __cxa_atexit(std::
                 vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
                 ::~vector,&getOpDesc(unsigned_int)::Descriptions,&__dso_handle);
    __cxa_guard_release(&getOpDesc(unsigned_int)::Descriptions);
  }
  uVar7 = (ulong)bVar2;
  uVar12 = (DAT_010d3138 - getOpDesc(unsigned_int)::Descriptions) * -0x5555555555555555;
  if (uVar12 < uVar7 || uVar12 - uVar7 == 0) {
    EVar11 = SizeNA;
    cVar3 = '\0';
    uVar9 = 0xff;
  }
  else {
    lVar13 = uVar7 * 3;
    cVar3 = *(char *)(getOpDesc(unsigned_int)::Descriptions + lVar13);
    uVar9 = *(undefined1 *)(getOpDesc(unsigned_int)::Descriptions + 1 + lVar13);
    EVar11 = *(Encoding *)(getOpDesc(unsigned_int)::Descriptions + 2 + lVar13);
  }
  (this->Desc).Op[1] = EVar11;
  (this->Desc).Version = cVar3;
  (this->Desc).Op[0] = uVar9;
  if (cVar3 != '\0') {
    uVar10 = '\x04';
    if (Version == 2) {
      uVar10 = AddressSize;
    }
    lVar13 = 2;
    do {
      EVar11 = (this->Desc).Op[lVar13 + -2];
      if (EVar11 == SizeNA) {
        bVar1 = false;
        iVar6 = 2;
        goto LAB_00d8a14a;
      }
      switch(EVar11 & ~SignBit) {
      case Size1:
        bVar2 = DataExtractor::getU8(&Data,&local_38,(Error *)0x0);
        *(ulong *)((long)&this->Desc + lVar13 * 8 + -1) = (ulong)bVar2;
        if (-1 < (char)EVar11) break;
        uVar8 = (uint64_t)(char)bVar2;
        goto LAB_00d8a139;
      case Size2:
        uVar4 = DataExtractor::getU16(&Data,&local_38,(Error *)0x0);
        *(ulong *)((long)&this->Desc + lVar13 * 8 + -1) = (ulong)uVar4;
        if ((char)EVar11 < '\0') {
          uVar8 = (uint64_t)(short)uVar4;
          goto LAB_00d8a139;
        }
        break;
      case Size4:
        uVar5 = DataExtractor::getU32(&Data,&local_38,(Error *)0x0);
        *(ulong *)((long)&this->Desc + lVar13 * 8 + -1) = (ulong)uVar5;
        if ((char)EVar11 < '\0') {
          uVar8 = (uint64_t)(int)uVar5;
          goto LAB_00d8a139;
        }
        break;
      case Size8:
        goto switchD_00d8a024_caseD_3;
      case SizeLEB:
        if ((char)EVar11 < '\0') {
          uVar8 = DataExtractor::getSLEB128(&Data,&local_38);
          goto LAB_00d8a139;
        }
      case BaseTypeRef:
        uVar8 = DataExtractor::getULEB128(&Data,&local_38,(Error *)0x0);
        goto LAB_00d8a139;
      case SizeAddr:
        if (AddressSize == '\x02') {
LAB_00d8a11a:
          uVar4 = DataExtractor::getU16(&Data,&local_38,(Error *)0x0);
          uVar8 = (uint64_t)uVar4;
          goto LAB_00d8a139;
        }
        if (AddressSize == '\x04') {
LAB_00d8a108:
          uVar5 = DataExtractor::getU32(&Data,&local_38,(Error *)0x0);
          uVar8 = (uint64_t)uVar5;
          goto LAB_00d8a139;
        }
        if (AddressSize != '\b') {
          __assert_fail("AddressSize == 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFExpression.cpp"
                        ,0xa5,
                        "bool llvm::DWARFExpression::Operation::extract(DataExtractor, uint16_t, uint8_t, uint64_t)"
                       );
        }
        goto switchD_00d8a024_caseD_3;
      case SizeRefAddr:
        if (uVar10 == '\x02') goto LAB_00d8a11a;
        if (uVar10 == '\x04') goto LAB_00d8a108;
        if (uVar10 != '\b') {
          __assert_fail("getRefAddrSize(AddressSize, Version) == 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFExpression.cpp"
                        ,0xaf,
                        "bool llvm::DWARFExpression::Operation::extract(DataExtractor, uint16_t, uint8_t, uint64_t)"
                       );
        }
switchD_00d8a024_caseD_3:
        uVar8 = DataExtractor::getU64(&Data,&local_38,(Error *)0x0);
LAB_00d8a139:
        *(uint64_t *)((long)&this->Desc + lVar13 * 8 + -1) = uVar8;
        break;
      case SizeBlock:
        if (lVar13 == 2) {
          iVar6 = 1;
          bVar1 = false;
          goto LAB_00d8a14a;
        }
        *(uint64_t *)((long)&this->Desc + lVar13 * 8 + -1) = local_38;
        local_38 = local_38 + this->Operands[0];
        break;
      default:
        llvm_unreachable_internal
                  ("Unknown DWARFExpression Op size",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFExpression.cpp"
                   ,0xc5);
      }
      this->Operands[lVar13] = local_38;
      iVar6 = 0;
      bVar1 = true;
LAB_00d8a14a:
      if (!bVar1) goto LAB_00d8a174;
      lVar13 = lVar13 + 1;
    } while (lVar13 == 3);
    iVar6 = 2;
LAB_00d8a174:
    if (iVar6 != 2) {
      return false;
    }
  }
  this->EndOffset = local_38;
  return cVar3 != '\0';
}

Assistant:

bool DWARFExpression::Operation::extract(DataExtractor Data, uint16_t Version,
                                         uint8_t AddressSize, uint64_t Offset) {
  Opcode = Data.getU8(&Offset);

  Desc = getOpDesc(Opcode);
  if (Desc.Version == Operation::DwarfNA) {
    EndOffset = Offset;
    return false;
  }

  for (unsigned Operand = 0; Operand < 2; ++Operand) {
    unsigned Size = Desc.Op[Operand];
    unsigned Signed = Size & Operation::SignBit;

    if (Size == Operation::SizeNA)
      break;

    switch (Size & ~Operation::SignBit) {
    case Operation::Size1:
      Operands[Operand] = Data.getU8(&Offset);
      if (Signed)
        Operands[Operand] = (int8_t)Operands[Operand];
      break;
    case Operation::Size2:
      Operands[Operand] = Data.getU16(&Offset);
      if (Signed)
        Operands[Operand] = (int16_t)Operands[Operand];
      break;
    case Operation::Size4:
      Operands[Operand] = Data.getU32(&Offset);
      if (Signed)
        Operands[Operand] = (int32_t)Operands[Operand];
      break;
    case Operation::Size8:
      Operands[Operand] = Data.getU64(&Offset);
      break;
    case Operation::SizeAddr:
      if (AddressSize == 8) {
        Operands[Operand] = Data.getU64(&Offset);
      } else if (AddressSize == 4) {
        Operands[Operand] = Data.getU32(&Offset);
      } else {
        assert(AddressSize == 2);
        Operands[Operand] = Data.getU16(&Offset);
      }
      break;
    case Operation::SizeRefAddr:
      if (getRefAddrSize(AddressSize, Version) == 8) {
        Operands[Operand] = Data.getU64(&Offset);
      } else if (getRefAddrSize(AddressSize, Version) == 4) {
        Operands[Operand] = Data.getU32(&Offset);
      } else {
        assert(getRefAddrSize(AddressSize, Version) == 2);
        Operands[Operand] = Data.getU16(&Offset);
      }
      break;
    case Operation::SizeLEB:
      if (Signed)
        Operands[Operand] = Data.getSLEB128(&Offset);
      else
        Operands[Operand] = Data.getULEB128(&Offset);
      break;
    case Operation::BaseTypeRef:
      Operands[Operand] = Data.getULEB128(&Offset);
      break;
    case Operation::SizeBlock:
      // We need a size, so this cannot be the first operand
      if (Operand == 0)
        return false;
      // Store the offset of the block as the value.
      Operands[Operand] = Offset;
      Offset += Operands[Operand - 1];
      break;
    default:
      llvm_unreachable("Unknown DWARFExpression Op size");
    }

    OperandEndOffsets[Operand] = Offset;
  }

  EndOffset = Offset;
  return true;
}